

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

void __thiscall cmQtAutoGenerators::LogWarning(cmQtAutoGenerators *this,string *message)

{
  ulong uVar1;
  char *pcVar2;
  size_t length;
  string local_38 [8];
  string msg;
  string *message_local;
  cmQtAutoGenerators *this_local;
  
  msg.field_2._8_8_ = message;
  std::__cxx11::string::string(local_38,(string *)message);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar2 != '\n') {
      std::__cxx11::string::push_back((char)local_38);
    }
    std::__cxx11::string::push_back((char)local_38);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    length = std::__cxx11::string::size();
    cmSystemTools::Stdout(pcVar2,length);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmQtAutoGenerators::LogWarning(const std::string& message) const
{
  std::string msg(message);
  if (!msg.empty()) {
    if (msg[msg.size() - 1] != '\n') {
      msg.push_back('\n');
    }
    // Append empty line
    msg.push_back('\n');
    cmSystemTools::Stdout(msg.c_str(), msg.size());
  }
}